

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Sym * find_D_Sym_in_Scope_internal(D_Scope *st,char *name,int len,uint h)

{
  int iVar1;
  D_Sym *pDVar2;
  D_Sym *local_30;
  D_Sym *ll;
  uint h_local;
  int len_local;
  char *name_local;
  D_Scope *st_local;
  
  name_local = (char *)st;
  while( true ) {
    if (name_local == (char *)0x0) {
      return (D_Sym *)0x0;
    }
    if (*(long *)(name_local + 0x10) == 0) {
      local_30 = *(D_Sym **)(name_local + 8);
    }
    else {
      local_30 = *(D_Sym **)
                  (*(long *)(*(long *)(name_local + 0x10) + 0x10) +
                  ((ulong)h % (ulong)*(uint *)(*(long *)(name_local + 0x10) + 8)) * 8);
    }
    for (; local_30 != (D_Sym *)0x0; local_30 = local_30->next) {
      if (((local_30->hash == h) && (local_30->len == len)) &&
         (iVar1 = strncmp(local_30->name,name,(long)len), iVar1 == 0)) {
        return local_30;
      }
    }
    if ((*(long *)(name_local + 0x28) != 0) &&
       (pDVar2 = find_D_Sym_in_Scope_internal(*(D_Scope **)(name_local + 0x28),name,len,h),
       pDVar2 != (D_Sym *)0x0)) {
      return pDVar2;
    }
    if (*(long *)(name_local + 0x20) == 0) {
      return (D_Sym *)0x0;
    }
    if (*(long *)(*(long *)(name_local + 0x20) + 0x30) != *(long *)(name_local + 0x30)) break;
    name_local = *(char **)(name_local + 0x20);
  }
  return (D_Sym *)0x0;
}

Assistant:

static D_Sym *find_D_Sym_in_Scope_internal(D_Scope *st, char *name, int len, uint h) {
  D_Sym *ll;
  for (; st; st = st->search) {
    if (st->hash)
      ll = st->hash->syms.v[h % st->hash->syms.n];
    else
      ll = st->ll;
    while (ll) {
      if (ll->hash == h && ll->len == len && !strncmp(ll->name, name, len)) return ll;
      ll = ll->next;
    }
    if (st->dynamic)
      if ((ll = find_D_Sym_in_Scope_internal(st->dynamic, name, len, h))) return ll;
    if (!st->search || st->search->up != st->up) break;
  }
  return NULL;
}